

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

int64_t duckdb::ExtractElement<duckdb::timestamp_t>(DatePartSpecifier type,timestamp_t element)

{
  NotImplementedException *this;
  timestamp_t in_RSI;
  undefined1 in_DIL;
  timestamp_t in_stack_fffffffffffffef0;
  allocator *paVar1;
  allocator local_e9;
  string local_e8 [224];
  int64_t local_8;
  
  switch(in_DIL) {
  case 0:
    local_8 = DatePart::YearOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffef0)
    ;
    break;
  case 1:
    local_8 = DatePart::MonthOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 2:
    local_8 = DatePart::DayOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffef0);
    break;
  case 3:
    local_8 = DatePart::DecadeOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 4:
    local_8 = DatePart::CenturyOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 5:
    local_8 = DatePart::MillenniumOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 6:
    local_8 = DatePart::MicrosecondsOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 7:
    local_8 = DatePart::MillisecondsOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 8:
    local_8 = DatePart::SecondsOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 9:
    local_8 = DatePart::MinutesOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 10:
    local_8 = DatePart::HoursOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0xb:
    local_8 = DatePart::DayOfWeekOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0xc:
    local_8 = DatePart::ISODayOfWeekOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0xd:
    local_8 = DatePart::WeekOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffef0)
    ;
    break;
  case 0xe:
    local_8 = DatePart::ISOYearOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0xf:
    local_8 = DatePart::QuarterOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0x10:
    local_8 = DatePart::DayOfYearOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0x11:
    local_8 = DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffef0);
    break;
  case 0x12:
    local_8 = DatePart::EraOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffef0);
    break;
  case 0x13:
    local_8 = DatePart::TimezoneOperator::Operation<duckdb::timestamp_t,long>(in_RSI);
    break;
  case 0x14:
    local_8 = DatePart::TimezoneHourOperator::Operation<duckdb::timestamp_t,long>(in_RSI);
    break;
  case 0x15:
    local_8 = DatePart::TimezoneMinuteOperator::Operation<duckdb::timestamp_t,long>(in_RSI);
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    paVar1 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Specifier type not implemented for DATEPART",paVar1);
    duckdb::NotImplementedException::NotImplementedException(this,local_e8);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  return local_8;
}

Assistant:

static int64_t ExtractElement(DatePartSpecifier type, T element) {
	switch (type) {
	case DatePartSpecifier::YEAR:
		return DatePart::YearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MONTH:
		return DatePart::MonthOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DAY:
		return DatePart::DayOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DECADE:
		return DatePart::DecadeOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::CENTURY:
		return DatePart::CenturyOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MILLENNIUM:
		return DatePart::MillenniumOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::QUARTER:
		return DatePart::QuarterOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DOW:
		return DatePart::DayOfWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ISODOW:
		return DatePart::ISODayOfWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DOY:
		return DatePart::DayOfYearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::WEEK:
		return DatePart::WeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ISOYEAR:
		return DatePart::ISOYearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::YEARWEEK:
		return DatePart::YearWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MICROSECONDS:
		return DatePart::MicrosecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MILLISECONDS:
		return DatePart::MillisecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::SECOND:
		return DatePart::SecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MINUTE:
		return DatePart::MinutesOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::HOUR:
		return DatePart::HoursOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ERA:
		return DatePart::EraOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE:
		return DatePart::TimezoneOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE_HOUR:
		return DatePart::TimezoneHourOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE_MINUTE:
		return DatePart::TimezoneMinuteOperator::template Operation<T, int64_t>(element);
	default:
		throw NotImplementedException("Specifier type not implemented for DATEPART");
	}
}